

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot_async.cpp
# Opt level: O0

double eval_arg<double>(char *s,double min,double max)

{
  byte bVar1;
  long *plVar2;
  runtime_error *this;
  allocator<char> local_1c9;
  string local_1c8 [32];
  istringstream local_1a8 [8];
  istringstream in;
  double local_28;
  double value;
  double max_local;
  double min_local;
  char *s_local;
  
  value = max;
  max_local = min;
  min_local = (double)s;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1c8,s,&local_1c9);
  std::__cxx11::istringstream::istringstream(local_1a8,local_1c8,_S_in);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  plVar2 = (long *)std::istream::operator>>((istream *)local_1a8,&local_28);
  bVar1 = std::ios::operator!((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
  if ((((bVar1 & 1) == 0) && (max_local <= local_28)) && (local_28 <= value)) {
    std::__cxx11::istringstream::~istringstream(local_1a8);
    return local_28;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"invalid value");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T eval_arg(const char* s, T min, T max)
{
    T value;
    std::istringstream in{s};

    if (!(in >> value) || value < min || value > max)
        throw std::runtime_error("invalid value");

    return value;
}